

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdAddPsbtTxOutWithPubkey
              (void *handle,void *psbt_handle,int64_t amount,char *locking_script,char *descriptor,
              uint32_t *index)

{
  bool bVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  char *in_RCX;
  int64_t in_RDX;
  long in_RSI;
  char *in_R8;
  uint32_t *in_R9;
  CfdException *except;
  exception *std_except;
  string err_msg;
  DescriptorScriptReference ref;
  KeyData key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path_args;
  Descriptor desc;
  uint32_t txout_index;
  Script script;
  CfdCapiPsbtHandle *psbt_obj;
  int result;
  DescriptorScriptReference *in_stack_fffffffffffff520;
  string *in_stack_fffffffffffff530;
  string *message;
  CfdError in_stack_fffffffffffff53c;
  CfdException *in_stack_fffffffffffff540;
  Psbt *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined4 in_stack_fffffffffffff568;
  undefined1 in_stack_fffffffffffff56d;
  byte bVar4;
  byte bVar5;
  undefined6 in_stack_fffffffffffff5d8;
  undefined1 in_stack_fffffffffffff5de;
  _Alloc_hider in_stack_fffffffffffff5df;
  Address *in_stack_fffffffffffff5e0;
  Amount *in_stack_fffffffffffff5e8;
  undefined8 in_stack_fffffffffffff5f0;
  CfdSourceLocation local_a00;
  Amount local_9e8;
  string *in_stack_fffffffffffff628;
  void *in_stack_fffffffffffff630;
  Amount local_860;
  undefined1 local_849;
  CfdSourceLocation local_828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_809;
  byte local_7e1;
  Script local_7e0;
  DescriptorScriptReference local_7a8;
  KeyData local_458;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_308;
  allocator local_2e9;
  string local_2e8;
  Descriptor local_2c8;
  allocator local_159;
  string local_158;
  Script local_138;
  uint32_t local_fc;
  Script local_f8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  CfdSourceLocation local_98;
  long local_80;
  allocator local_71;
  string local_70 [52];
  undefined4 local_3c;
  uint32_t *local_38;
  char *local_30;
  char *local_28;
  int64_t local_20;
  long local_18;
  int local_4;
  
  local_3c = 0xffffffff;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"PsbtHandle",&local_71);
  cfd::capi::CheckBuffer(in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  local_80 = local_18;
  if (*(long *)(local_18 + 0x18) == 0) {
    local_98.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_98.filename = local_98.filename + 1;
    local_98.line = 0x4fc;
    local_98.funcname = "CfdAddPsbtTxOutWithPubkey";
    cfd::core::logger::warn<>(&local_98,"psbt is null.");
    local_ba = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"Failed to handle statement. psbt is null.",&local_b9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff540,in_stack_fffffffffffff53c,in_stack_fffffffffffff530);
    local_ba = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::Script::Script(&local_f8);
  local_fc = 0;
  bVar1 = cfd::capi::IsEmptyString(local_28);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_158,local_28,&local_159);
    cfd::core::Script::Script(&local_138,&local_158);
    cfd::core::Script::operator=(&local_f8,&local_138);
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffff520);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
  }
  bVar1 = cfd::capi::IsEmptyString(local_30);
  if (bVar1) {
    bVar1 = cfd::core::Script::IsEmpty(&local_f8);
    if (bVar1) {
      local_a00.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                   ,0x2f);
      local_a00.filename = local_a00.filename + 1;
      local_a00.line = 0x51a;
      local_a00.funcname = "CfdAddPsbtTxOutWithPubkey";
      cfd::core::logger::warn<>(&local_a00,"locking_script is null or empty.");
      uVar3 = __cxa_allocate_exception(0x30);
      message = (string *)&stack0xfffffffffffff5df;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffff5e0,
                 "Failed to parameter. locking_script is null or empty.",(allocator *)message);
      cfd::core::CfdException::CfdException
                (in_stack_fffffffffffff540,in_stack_fffffffffffff53c,message);
      __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    this = *(Psbt **)(local_80 + 0x18);
    cfd::core::Amount::Amount(&local_9e8,local_20);
    local_fc = cfd::core::Psbt::AddTxOut(this,&local_f8,&local_9e8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2e8,local_30,&local_2e9);
    cfd::core::Descriptor::Parse
              (&local_2c8,&local_2e8,
               (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                *)0x0);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x5f35df);
    cfd::core::Descriptor::GetKeyData(&local_458,&local_2c8,&local_308);
    cfd::core::Descriptor::GetReference(&local_7a8,&local_2c8,&local_308);
    local_7e1 = 0;
    uVar2 = cfd::core::Script::IsEmpty(&local_f8);
    bVar4 = 0;
    if (!(bool)uVar2) {
      cfd::core::DescriptorScriptReference::GetLockingScript(&local_7e0,&local_7a8);
      local_7e1 = 1;
      in_stack_fffffffffffff56d = cfd::core::Script::Equals(&local_f8,&local_7e0);
      bVar4 = in_stack_fffffffffffff56d ^ 0xff;
    }
    bVar5 = bVar4;
    if ((local_7e1 & 1) != 0) {
      cfd::core::Script::~Script((Script *)in_stack_fffffffffffff520);
    }
    if ((bVar4 & 1) != 0) {
      __rhs = &local_809;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_809.field_0x1,"locking_script doesn\'t match the descriptor.",
                 (allocator *)__rhs);
      std::allocator<char>::~allocator((allocator<char> *)&local_809);
      local_828.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                   ,0x2f);
      local_828.filename = local_828.filename + 1;
      local_828.line = 0x50f;
      local_828.funcname = "CfdAddPsbtTxOutWithPubkey";
      cfd::core::logger::warn<std::__cxx11::string&>
                (&local_828,"{}",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_809.field_0x1);
      local_849 = 1;
      uVar3 = __cxa_allocate_exception(0x30);
      std::operator+((char *)CONCAT17(uVar2,CONCAT16(bVar5,CONCAT15(in_stack_fffffffffffff56d,
                                                                    CONCAT14(bVar4,
                                                  in_stack_fffffffffffff568)))),__rhs);
      cfd::core::CfdException::CfdException
                (in_stack_fffffffffffff540,in_stack_fffffffffffff53c,in_stack_fffffffffffff530);
      local_849 = 0;
      __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    cfd::core::Amount::Amount(&local_860,local_20);
    cfd::core::DescriptorScriptReference::GenerateAddress
              ((Address *)&stack0xfffffffffffff628,&local_7a8,*(NetType *)(local_80 + 0x10));
    local_fc = cfd::Psbt::AddTxOutData
                         ((Psbt *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
                          in_stack_fffffffffffff5e0,
                          (KeyData *)
                          CONCAT17(in_stack_fffffffffffff5df,
                                   CONCAT16(in_stack_fffffffffffff5de,in_stack_fffffffffffff5d8)));
    cfd::core::Address::~Address((Address *)in_stack_fffffffffffff520);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference(in_stack_fffffffffffff520);
    cfd::core::KeyData::~KeyData((KeyData *)in_stack_fffffffffffff520);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff530);
    cfd::core::Descriptor::~Descriptor((Descriptor *)0x5f39da);
  }
  if (local_38 != (uint32_t *)0x0) {
    *local_38 = local_fc;
  }
  local_4 = 0;
  cfd::core::Script::~Script((Script *)in_stack_fffffffffffff520);
  return local_4;
}

Assistant:

int CfdAddPsbtTxOutWithPubkey(
    void* handle, void* psbt_handle, int64_t amount,
    const char* locking_script, const char* descriptor, uint32_t* index) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    Script script;
    uint32_t txout_index = 0;
    if (!IsEmptyString(locking_script)) {
      script = Script(locking_script);
    }

    if (!IsEmptyString(descriptor)) {
      Descriptor desc = Descriptor::Parse(descriptor);
      std::vector<std::string> path_args;
      auto key = desc.GetKeyData(path_args);
      auto ref = desc.GetReference(&path_args);
      if ((!script.IsEmpty()) && (!script.Equals(ref.GetLockingScript()))) {
        std::string err_msg = "locking_script doesn't match the descriptor.";
        warn(CFD_LOG_SOURCE, "{}", err_msg);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. " + err_msg);
      }

      txout_index = psbt_obj->psbt->AddTxOutData(
          Amount(amount), ref.GenerateAddress(psbt_obj->net_type), key);
    } else if (!script.IsEmpty()) {
      txout_index = psbt_obj->psbt->AddTxOut(script, Amount(amount));
    } else {
      warn(CFD_LOG_SOURCE, "locking_script is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. locking_script is null or empty.");
    }

    if (index != nullptr) *index = txout_index;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}